

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O3

void __thiscall test::test_load_and_export_private::test_method(test_load_and_export_private *this)

{
  int iVar1;
  is_classifiedF *IsSpace;
  string pk_str;
  string pk_exported;
  long *local_120;
  locale local_118 [8];
  locale local_110 [8];
  undefined1 local_108 [8];
  size_t local_100;
  undefined1 local_f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 local_a8;
  undefined8 local_a0;
  shared_count sStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  locale local_68 [8];
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_30;
  char *local_28;
  
  license::CryptoHelper::getInstance();
  loadPrivateKey_abi_cxx11_();
  (**(code **)(*local_120 + 0x20))(local_120,local_c8);
  (**(code **)(*local_120 + 8))(local_90);
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
  ;
  local_28 = "";
  IsSpace = (is_classifiedF *)&local_40;
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_30,0x46);
  std::locale::locale(local_110);
  local_108._0_2_ = 0x2000;
  std::locale::locale((locale *)&local_100,local_110);
  boost::algorithm::trim_copy_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
            (&local_e8,(algorithm *)local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,IsSpace)
  ;
  std::locale::~locale((locale *)&local_100);
  std::locale::locale(local_118);
  local_70._0_2_ = 0x2000;
  std::locale::locale(local_68,local_118);
  boost::algorithm::trim_copy_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
             (algorithm *)local_c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,IsSpace);
  std::locale::~locale(local_68);
  if (local_e8._M_string_length == local_100) {
    if (local_e8._M_string_length == 0) {
      local_a8 = true;
    }
    else {
      iVar1 = bcmp(local_e8._M_dataplus._M_p,(void *)CONCAT62(local_108._2_6_,local_108._0_2_),
                   local_e8._M_string_length);
      local_a8 = iVar1 == 0;
    }
  }
  else {
    local_a8 = false;
  }
  local_a0 = 0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_68[0] = (locale)0x0;
  local_70 = (undefined1  [8])&PTR__lazy_ostream_00542d70;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_58 = "imported and exported keys are the same";
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
  ;
  local_48 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_98);
  if ((undefined1 *)CONCAT62(local_108._2_6_,local_108._0_2_) != local_f8) {
    operator_delete((undefined1 *)CONCAT62(local_108._2_6_,local_108._0_2_));
  }
  std::locale::~locale(local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  std::locale::~locale(local_110);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_load_and_export_private) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	const std::string pk_str = loadPrivateKey();
	crypto->loadPrivateKey(pk_str);
	std::string pk_exported = crypto->exportPrivateKey();
	// cout<<pk_str<<endl;
	// cout<<pk_exported<<endl;
	BOOST_CHECK_MESSAGE(boost::trim_copy(pk_exported) == boost::trim_copy(pk_str),
						"imported and exported keys are the same");
	crypto.release();
}